

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_nav2D.cpp
# Opt level: O2

void __thiscall
EnvironmentNAV2D::GetSuccsofChangedEdges
          (EnvironmentNAV2D *this,
          vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *changedcellsV,
          vector<int,_std::allocator<int>_> *succs_of_changededgesIDV)

{
  value_type vVar1;
  const_reference pvVar2;
  int iVar3;
  long lVar4;
  int local_48;
  int local_44;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *local_40;
  size_type local_38;
  
  local_40 = changedcellsV;
  for (local_38 = 0;
      (long)local_38 <
      (long)(int)((ulong)((long)(local_40->
                                super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_40->
                               super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
      local_38 = local_38 + 1) {
    pvVar2 = std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::at(local_40,local_38);
    vVar1 = *pvVar2;
    local_44 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x28])
                         (this,(ulong)vVar1 & 0xffffffff,(ulong)vVar1 >> 0x20);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(succs_of_changededgesIDV,&local_44);
    for (lVar4 = 0; lVar4 < (this->EnvNAV2DCfg).numofdirs; lVar4 = lVar4 + 1) {
      iVar3 = (this->EnvNAV2DCfg).dx_[lVar4] + vVar1.x;
      if ((-1 < iVar3) && (iVar3 < (this->EnvNAV2DCfg).EnvWidth_c)) {
        iVar3 = (this->EnvNAV2DCfg).dy_[lVar4] + vVar1.y;
        if ((-1 < iVar3) && (iVar3 < (this->EnvNAV2DCfg).EnvHeight_c)) {
          local_48 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x28])
                               (this);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    (succs_of_changededgesIDV,&local_48);
        }
      }
    }
  }
  return;
}

Assistant:

void EnvironmentNAV2D::GetSuccsofChangedEdges(vector<nav2dcell_t> const * changedcellsV,
                                              vector<int> *succs_of_changededgesIDV)
{
    nav2dcell_t cell;
    int aind;

    for (int i = 0; i < (int)changedcellsV->size(); i++) {
        cell = changedcellsV->at(i);
        succs_of_changededgesIDV->push_back(GetStateFromCoord(cell.x, cell.y));
        for (aind = 0; aind < EnvNAV2DCfg.numofdirs; aind++) {
            int affx = cell.x + EnvNAV2DCfg.dx_[aind];
            int affy = cell.y + EnvNAV2DCfg.dy_[aind];
            if (affx < 0 || affx >= EnvNAV2DCfg.EnvWidth_c || affy < 0 || affy >= EnvNAV2DCfg.EnvHeight_c) continue;
            succs_of_changededgesIDV->push_back(GetStateFromCoord(affx, affy));
        }
    }
}